

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::pairWith(AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var4;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var5;
  size_t sVar6;
  vector<char,_std::allocator<char>_> *this_00;
  string *psVar7;
  string *psVar8;
  reference pvVar9;
  ShortDnaSequence *in_RDX;
  long in_RSI;
  AlignmentRecord *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref3;
  string querySequence_1;
  uint s_1;
  CigarOp *it_1;
  iterator __end3;
  iterator __begin3;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range3;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref2;
  string querySequence;
  uint s;
  CigarOp *it;
  iterator __end2;
  iterator __begin2;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range2;
  ShortDnaSequence *in_stack_fffffffffffff8b8;
  ShortDnaSequence *in_stack_fffffffffffff8c0;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
  *in_stack_fffffffffffff8c8;
  string *this_01;
  string *in_stack_fffffffffffff8d0;
  string *this_02;
  string *in_stack_fffffffffffff908;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff910;
  string *this_03;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 uVar10;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffff960;
  string *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  ShortDnaSequence *in_stack_fffffffffffff9b0;
  string local_630 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610 [2];
  string local_5e0 [32];
  string local_5c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a0;
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [46];
  char in_stack_fffffffffffffb46;
  char in_stack_fffffffffffffb47;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb48;
  string *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  char in_stack_fffffffffffffb70;
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420;
  string local_400 [32];
  string local_3e0 [24];
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc4c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  AlignmentRecord *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffca0;
  BamAlignment *in_stack_fffffffffffffca8;
  AlignmentRecord *in_stack_fffffffffffffcb0;
  string local_340 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  char in_stack_fffffffffffffd06;
  char in_stack_fffffffffffffd07;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  string in_stack_fffffffffffffd30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0 [5];
  string local_238 [144];
  string local_1a8 [36];
  uint local_184;
  reference local_180;
  CigarOp *local_178;
  __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_170;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_168;
  string local_100 [160];
  string local_60 [36];
  uint local_3c;
  reference local_38;
  CigarOp *local_30;
  __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_28;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_20;
  ShortDnaSequence *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDI->end1 < *(int *)(in_RSI + 0xac) + 1U) {
    in_RDI->single_end = false;
    in_RDI->start2 = *(int *)(in_RSI + 0xac) + 1;
    uVar2 = BamTools::BamAlignment::GetEndPosition(SUB81(in_RSI,0),false);
    in_RDI->end2 = uVar2;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (in_stack_fffffffffffff960,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    iVar3 = phred_sum(in_stack_fffffffffffff8d0,(char)((ulong)in_stack_fffffffffffff8c8 >> 0x38));
    in_RDI->phred_sum2 = iVar3;
    local_20 = &in_RDI->cigar2;
    local_28._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                    in_stack_fffffffffffff8b8);
    local_30 = (CigarOp *)
               std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                         ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                          in_stack_fffffffffffff8b8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffff8c0,
                              (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffff8b8), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                 ::operator*(&local_28);
      for (local_3c = 0; local_3c < local_38->Length; local_3c = local_3c + 1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0,
                   (value_type *)in_stack_fffffffffffff8c8);
      }
      if ((local_38->Type == 'D') &&
         (in_RDI->length_incl_deletions2 = local_38->Length + in_RDI->length_incl_deletions2,
         1 < local_38->Length)) {
        in_RDI->length_incl_longdeletions2 = local_38->Length + in_RDI->length_incl_longdeletions2;
      }
      __gnu_cxx::
      __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_28);
    }
    std::__cxx11::string::string(local_60,(string *)(local_10 + 0x28));
    getCigar2Unrolled(in_RDI);
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffff910,
               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff908);
    std::__cxx11::string::string(local_100,(string *)(local_10 + 0x68));
    referenceString(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                    in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_100);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    ShortDnaSequence::operator=(in_stack_fffffffffffff8c0,local_18);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff8c0);
    p_Var4 = std::
             get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x29013d);
    std::__cxx11::string::operator=((string *)&in_RDI->reference_seq2,(string *)p_Var4);
    p_Var5 = std::
             get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                         *)0x290163);
    std::__cxx11::string::operator=((string *)&in_RDI->alignSequence2,(string *)p_Var5);
    std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)0x290189);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    sVar6 = ShortDnaSequence::size((ShortDnaSequence *)0x2901b6);
    in_RDI->length_incl_deletions2 = (int)sVar6;
    sVar6 = ShortDnaSequence::size((ShortDnaSequence *)0x2901e2);
    in_RDI->length_incl_longdeletions2 = (int)sVar6;
    coveredPositions((AlignmentRecord *)
                     CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::operator=
              ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
               in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::~vector
              ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
               in_stack_fffffffffffff8d0);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
              *)0x290247);
    std::__cxx11::string::~string(local_60);
    in_stack_fffffffffffff8b8 = local_18;
  }
  else {
    uVar2 = BamTools::BamAlignment::GetEndPosition(SUB81(in_RSI,0),false);
    if (uVar2 < in_RDI->start1) {
      in_RDI->single_end = false;
      in_RDI->start2 = in_RDI->start1;
      in_RDI->end2 = in_RDI->end1;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                (in_stack_fffffffffffff960,
                 (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      ShortDnaSequence::operator=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
      std::__cxx11::string::operator=
                ((string *)&in_RDI->reference_seq2,(string *)&in_RDI->reference_seq1);
      std::__cxx11::string::operator=
                ((string *)&in_RDI->alignSequence2,(string *)&in_RDI->alignSequence1);
      std::__cxx11::string::operator=((string *)&in_RDI->code2,(string *)&in_RDI->code1);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      in_RDI->phred_sum2 = in_RDI->phred_sum1;
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff960,
                 (vector<char,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      in_RDI->length_incl_deletions2 = in_RDI->length_incl_deletions1;
      in_RDI->length_incl_longdeletions2 = in_RDI->length_incl_longdeletions1;
      in_RDI->start1 = *(int *)(local_10 + 0xac) + 1;
      uVar2 = BamTools::BamAlignment::GetEndPosition(SUB81(local_10,0),false);
      in_RDI->end1 = uVar2;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                (in_stack_fffffffffffff960,
                 (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      iVar3 = phred_sum(in_stack_fffffffffffff8d0,(char)((ulong)in_stack_fffffffffffff8c8 >> 0x38));
      in_RDI->phred_sum1 = iVar3;
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x290481);
      local_168 = &in_RDI->cigar1;
      local_170._M_current =
           (CigarOp *)
           std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                     ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                      in_stack_fffffffffffff8b8);
      local_178 = (CigarOp *)
                  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                             in_stack_fffffffffffff8b8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                                 *)in_stack_fffffffffffff8c0,
                                (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                                 *)in_stack_fffffffffffff8b8), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                    ::operator*(&local_170);
        for (local_184 = 0; local_184 < local_180->Length; local_184 = local_184 + 1) {
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0,
                     (value_type *)in_stack_fffffffffffff8c8);
        }
        if ((local_180->Type == 'D') &&
           (in_RDI->length_incl_deletions1 = local_180->Length + in_RDI->length_incl_deletions1,
           1 < local_180->Length)) {
          in_RDI->length_incl_longdeletions1 =
               local_180->Length + in_RDI->length_incl_longdeletions1;
        }
        __gnu_cxx::
        __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
        ::operator++(&local_170);
      }
      std::__cxx11::string::string(local_1a8,(string *)(local_10 + 0x28));
      this_00 = getCigar1Unrolled(in_RDI);
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffff910,
                 (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff908);
      uVar10 = *(undefined4 *)(local_10 + 0xac);
      std::__cxx11::string::string(local_238,(string *)(local_10 + 0x68));
      referenceString(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc70)
      ;
      std::__cxx11::string::~string(local_238);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
      ShortDnaSequence::ShortDnaSequence
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
      ShortDnaSequence::operator=(in_stack_fffffffffffff8c0,local_18);
      ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff8c0);
      p_Var4 = std::
               get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                         ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                           *)0x2906ce);
      std::__cxx11::string::operator=((string *)&in_RDI->reference_seq1,(string *)p_Var4);
      p_Var5 = std::
               get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                         ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                           *)0x2906f4);
      std::__cxx11::string::operator=((string *)&in_RDI->alignSequence1,(string *)p_Var5);
      std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                  *)0x29071a);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)this_00,
                 (vector<int,_std::allocator<int>_> *)CONCAT44(uVar10,in_stack_fffffffffffff958));
      sVar6 = ShortDnaSequence::size((ShortDnaSequence *)0x290744);
      in_RDI->length_incl_deletions1 = (int)sVar6;
      sVar6 = ShortDnaSequence::size((ShortDnaSequence *)0x29076a);
      in_RDI->length_incl_longdeletions1 = (int)sVar6;
      coveredPositions((AlignmentRecord *)CONCAT44(uVar10,in_stack_fffffffffffff958));
      std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::operator=
                ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                 in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::~vector
                ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                 in_stack_fffffffffffff8d0);
      std::__cxx11::string::size();
      std::vector<char,_std::allocator<char>_>::size(&in_RDI->cigar1_unrolled);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                *)0x290898);
      std::__cxx11::string::~string(local_1a8);
      in_stack_fffffffffffff8b8 = local_18;
    }
    else {
      getMergedDnaSequence
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    }
  }
  bVar1 = isStrand1(in_RDI);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd30,(string *)&in_RDI->reference_seq1);
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd10,(string *)&in_RDI->alignSequence1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff910,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff908);
    CTandCTOTReadCoder(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
                       ,in_stack_fffffffffffffd07,in_stack_fffffffffffffd06,
                       (char)in_stack_fffffffffffffd30);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_2b0,0);
    std::__cxx11::string::operator=((string *)&in_RDI->code1,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_2b0,1);
    std::__cxx11::string::operator=((string *)&in_RDI->gcQuality1,(string *)pvVar9);
    std::__cxx11::string::string(local_340,(string *)&in_RDI->reference_seq2);
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffca0,(string *)&in_RDI->alignSequence2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff910,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff908);
    CTandCTOTReadCoder(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
                       ,in_stack_fffffffffffffd07,in_stack_fffffffffffffd06,
                       (char)in_stack_fffffffffffffd30);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffca0);
    std::__cxx11::string::~string(local_340);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_320,0);
    std::__cxx11::string::operator=((string *)&in_RDI->code2,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_320,1);
    std::__cxx11::string::operator=((string *)&in_RDI->gcQuality2,(string *)pvVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8d0);
  }
  else if ((in_RDI->strand1 & 1U) == 0) {
    psVar7 = ShortDnaSequence::toString_abi_cxx11_((ShortDnaSequence *)0x290c76);
    std::__cxx11::string::string(local_400,(string *)psVar7);
    complement(in_stack_fffffffffffff908);
    ShortDnaSequence::qualityString_abi_cxx11_((ShortDnaSequence *)0x290cb0);
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    ShortDnaSequence::operator=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::string(local_440,(string *)&in_RDI->reference_seq1);
    complement(in_stack_fffffffffffff908);
    psVar7 = &local_420;
    std::__cxx11::string::operator=((string *)&in_RDI->reference_seq1,(string *)psVar7);
    std::__cxx11::string::~string((string *)psVar7);
    std::__cxx11::string::~string(local_440);
    this_03 = local_480;
    std::__cxx11::string::string(this_03,(string *)&in_RDI->alignSequence1);
    complement(psVar7);
    std::__cxx11::string::operator=((string *)&in_RDI->alignSequence1,local_460);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_480);
    psVar8 = ShortDnaSequence::toString_abi_cxx11_((ShortDnaSequence *)0x290e03);
    std::__cxx11::string::string(local_508,(string *)psVar8);
    complement(psVar7);
    ShortDnaSequence::qualityString_abi_cxx11_((ShortDnaSequence *)0x290e40);
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    ShortDnaSequence::operator=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_508);
    std::__cxx11::string::string(local_548,(string *)&in_RDI->reference_seq2);
    complement(psVar7);
    this_02 = local_528;
    std::__cxx11::string::operator=((string *)&in_RDI->reference_seq2,this_02);
    std::__cxx11::string::~string(this_02);
    std::__cxx11::string::~string(local_548);
    std::__cxx11::string::string(local_588,(string *)&in_RDI->alignSequence2);
    complement(psVar7);
    this_01 = local_568;
    std::__cxx11::string::operator=((string *)&in_RDI->alignSequence2,this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(local_588);
    std::__cxx11::string::string(local_5c0,(string *)&in_RDI->reference_seq1);
    std::__cxx11::string::string(local_5e0,(string *)&in_RDI->alignSequence1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_03,
               (vector<int,_std::allocator<int>_> *)psVar7);
    OBandCTOBReadCoder(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48
                       ,in_stack_fffffffffffffb47,in_stack_fffffffffffffb46,
                       in_stack_fffffffffffffb70);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
    std::__cxx11::string::~string(local_5e0);
    std::__cxx11::string::~string(local_5c0);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_5a0,0);
    std::__cxx11::string::operator=((string *)&in_RDI->code1,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_5a0,1);
    std::__cxx11::string::operator=((string *)&in_RDI->gcQuality1,(string *)pvVar9);
    std::__cxx11::string::string(local_630,(string *)&in_RDI->reference_seq2);
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff9b0,(string *)&in_RDI->alignSequence2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_03,
               (vector<int,_std::allocator<int>_> *)psVar7);
    OBandCTOBReadCoder(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48
                       ,in_stack_fffffffffffffb47,in_stack_fffffffffffffb46,
                       in_stack_fffffffffffffb70);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff9b0);
    std::__cxx11::string::~string(local_630);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_610,0);
    std::__cxx11::string::operator=((string *)&in_RDI->code2,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_610,1);
    std::__cxx11::string::operator=((string *)&in_RDI->gcQuality2,(string *)pvVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_02);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_02);
  }
  return;
}

Assistant:

void AlignmentRecord::pairWith(const BamTools::BamAlignment& alignment, string &mainReference) {

    if ((unsigned)(alignment.Position+1) > this->end1) {
        this->single_end = false;
        this->start2 = alignment.Position + 1;
        this->end2 = alignment.GetEndPosition();
        if (!(this->end2 > 0)){
            //cout << this->name << " end: " << this->end2 << endl;
        }
        this->cigar2 = alignment.CigarData;

        this->phred_sum2 = phred_sum(alignment.Qualities);


        for (const auto& it : cigar2) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar2_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions2+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions2+=it.Length;
                }
            }
        }
        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref2 = referenceString(this->getCigar2Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence2 = ShortDnaSequence(querySequence, alignment.Qualities);

        this->reference_seq2=std::get<0>(ref2);
        this->alignSequence2=std::get<1>(ref2);
        this->qualityList2 = std::get<2>(ref2);

        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        //End NoMe Additions
        this->cov_pos = this->coveredPositions();

    } else if ((unsigned)alignment.GetEndPosition() < this->start1) {
        this->single_end = false;
        this->start2 = this->start1;
        this->end2 = this->end1;
        this->cigar2 = this->cigar1;
        this->sequence2 = this->sequence1;
        this->reference_seq2 = this->reference_seq1;
        this->alignSequence2 = this->alignSequence1;
        this->code2 = this->code1;
        this->qualityList2 = this->qualityList1;
        this->phred_sum2 = this->phred_sum1;
        this->cigar2_unrolled = this->cigar1_unrolled;
        this->length_incl_deletions2 = this->length_incl_deletions1;
        this->length_incl_longdeletions2 = this->length_incl_longdeletions1;

        this->start1 = alignment.Position + 1;
        this->end1 = alignment.GetEndPosition();
        this->cigar1 = alignment.CigarData;

        this->phred_sum1 = phred_sum(alignment.Qualities);

        this->cigar1_unrolled.clear();
        for (const auto& it : cigar1) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar1_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions1+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions1+=it.Length;
                }
            }
        }

        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref3 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);
        this->reference_seq1 = std::get<0>(ref3);
        this->alignSequence1 = std::get<1>(ref3);
        this->qualityList1 = std::get<2>(ref3);

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();

        //End NoMe Additions
        this->cov_pos = this->coveredPositions();
        if(this->reference_seq1.size()-1!=this->cigar1_unrolled.size()){
            assert(false);
        }
    }//merging of overlapping paired ends to single end reads
    else {
        this->getMergedDnaSequence(alignment,mainReference);
    }

    //Reverse Complementing the pair 1 and two based on which strand they come from
    if(this->isStrand1()){
            //OT and CTOT reads, no need to complement these reads as they are already in the forward direction
            std::vector<string> codesAndQuality1 = CTandCTOTReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = CTandCTOTReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }else if(!this->strand1){
            //OB and CTOB reads. We need to complement these reads since we want the original reverse strand reads
            this->sequence1 = ShortDnaSequence(complement(this->sequence1.toString()), this->sequence1.qualityString());
            this->reference_seq1 = complement(this->reference_seq1);
            this->alignSequence1 = complement(this->alignSequence1);
            this->sequence2 = ShortDnaSequence(complement(this->sequence2.toString()), this->sequence2.qualityString());
            this->reference_seq2 = complement(this->reference_seq2);
            this->alignSequence2 = complement(this->alignSequence2);
            vector<string> codesAndQuality1 = OBandCTOBReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = OBandCTOBReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }
}